

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O2

fdb_kvs_handle * scan(storage_t *st,fdb_kvs_handle *reuse_kv)

{
  char *__s2;
  char *pcVar1;
  fdb_status fVar2;
  int iVar3;
  fdb_doc *doc;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_kvs_handle *snap_kv;
  idx_prams_t params;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  rdoc = (fdb_doc *)0x0;
  gen_index_params(&params);
  if (reuse_kv == (fdb_kvs_handle *)0x0) {
    fVar2 = fdb_snapshot_open(st->index1,&snap_kv,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
              ,0x1ce);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x1ce,"fdb_kvs_handle *scan(storage_t *, fdb_kvs_handle *)");
    }
  }
  else {
    fVar2 = fdb_snapshot_open(reuse_kv,&snap_kv,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
              ,0x1cb);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x1cb,"fdb_kvs_handle *scan(storage_t *, fdb_kvs_handle *)");
    }
  }
  __s2 = params.max;
  fVar2 = fdb_iterator_init(snap_kv,&it,&params,0xc,__s2,0xc,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    do {
      fVar2 = fdb_iterator_get(it,&rdoc);
      doc = rdoc;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar1 = (char *)rdoc->key;
        iVar3 = strcmp(pcVar1,params.min);
        if ((iVar3 < 0) || (iVar3 = strcmp(pcVar1,__s2), 0 < iVar3)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                  ,0x1db);
          doc = rdoc;
          pcVar1 = (char *)rdoc->key;
          iVar3 = strcmp(pcVar1,params.min);
          if ((iVar3 < 0) || (iVar3 = strcmp(pcVar1,__s2), 0 < iVar3)) {
            __assert_fail("((strcmp((char *)rdoc->key,params.min) >= 0) && (strcmp((char *)rdoc->key, params.max) <= 0))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                          ,0x1db,"fdb_kvs_handle *scan(storage_t *, fdb_kvs_handle *)");
          }
        }
        fdb_doc_free(doc);
        rdoc = (fdb_doc *)0x0;
      }
      fVar2 = fdb_iterator_next(it);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  }
  fdb_iterator_close(it);
  return snap_kv;
}

Assistant:

fdb_kvs_handle * scan(storage_t *st, fdb_kvs_handle *reuse_kv)
{
    TEST_INIT();

    fdb_kvs_handle *snap_kv;
    idx_prams_t params;
    fdb_status status;
    fdb_iterator *it;
    fdb_doc *rdoc = NULL;

    // generate params
    gen_index_params(&params);

    // create new snapkv or reuse current
    if(reuse_kv){
        status = fdb_snapshot_open(reuse_kv, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_snapshot_open(st->index1, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapkv
    status = fdb_iterator_init(snap_kv, &it, params.min, 12,
                               params.max, 12, FDB_ITR_NONE);
    if (status == FDB_RESULT_SUCCESS) {
        do {
            status = fdb_iterator_get(it, &rdoc);
            if (status == FDB_RESULT_SUCCESS){

                // make sure every doc is within requested range
                TEST_CHK(((strcmp((char *)rdoc->key,params.min) >= 0) &&
                       (strcmp((char *)rdoc->key, params.max) <= 0)));
                fdb_doc_free(rdoc);
                rdoc=NULL;
            }
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    }

    fdb_iterator_close(it);

    return snap_kv;
}